

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.c
# Opt level: O0

int asn1_template_ex_d2i
              (ASN1_VALUE **val,uchar **in,long inlen,ASN1_TEMPLATE *tt,char opt,ASN1_TLC *ctx,
              int depth,OSSL_LIB_CTX *libctx,char *propq)

{
  int iVar1;
  long len_00;
  ulong *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  ASN1_TLC *in_RDI;
  char in_R8B;
  int iVar2;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  undefined7 in_stack_00000010;
  char in_stack_00000017;
  ASN1_TEMPLATE *in_stack_00000018;
  undefined4 in_stack_00000020;
  undefined4 in_stack_00000024;
  uchar **in_stack_00000028;
  char cst;
  ASN1_VALUE **in_stack_00000030;
  char exp_eoc;
  uchar *q;
  uchar *p;
  long len;
  int ret;
  int aclass;
  int flags;
  undefined7 in_stack_00000068;
  undefined8 in_stack_ffffffffffffff60;
  char *pcVar3;
  undefined8 in_stack_ffffffffffffff68;
  int iVar4;
  undefined4 in_stack_ffffffffffffff74;
  uchar **in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff88;
  char in_stack_ffffffffffffff8e;
  char in_stack_ffffffffffffff8f;
  char *in_stack_ffffffffffffff90;
  uchar *oclass;
  uchar *puVar5;
  int *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffc0;
  
  if (in_RDI == (ASN1_TLC *)0x0) {
    return 0;
  }
  oclass = (uchar *)*in_RSI;
  if ((*in_RCX & 0x10) == 0) {
    iVar1 = asn1_template_noexp_d2i
                      (in_stack_00000030,in_stack_00000028,
                       CONCAT44(in_stack_00000024,in_stack_00000020),in_stack_00000018,
                       in_stack_00000017,(ASN1_TLC *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                       (int)ctx,(OSSL_LIB_CTX *)CONCAT17(opt,in_stack_00000068),(char *)tt);
    return iVar1;
  }
  pcVar3 = (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff60 >> 0x20),(int)in_RCX[1]);
  iVar4 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  iVar2 = (int)in_R8B;
  iVar1 = asn1_check_tlen((long *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          in_stack_ffffffffffffffa0,oclass,in_stack_ffffffffffffff90,
                          (char *)CONCAT17(in_stack_ffffffffffffff8f,
                                           CONCAT16(in_stack_ffffffffffffff8e,
                                                    in_stack_ffffffffffffff88)),
                          in_stack_ffffffffffffff80,CONCAT17(in_R8B,in_stack_ffffffffffffffc0),
                          (int)in_RCX,in_EDX,(char)in_RSI,in_RDI);
  if (iVar1 == 0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff74,iVar2),iVar4,pcVar3);
    ERR_set_error(0xd,0x8010a,(char *)0x0);
    return 0;
  }
  if (iVar1 == -1) {
    return -1;
  }
  if (in_stack_ffffffffffffff8e == '\0') {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff74,iVar2),iVar4,pcVar3);
    ERR_set_error(0xd,0x78,(char *)0x0);
    return 0;
  }
  pcVar3 = (char *)CONCAT17(in_stack_00000017,in_stack_00000010);
  puVar5 = oclass;
  iVar1 = asn1_template_noexp_d2i
                    (in_stack_00000030,in_stack_00000028,
                     CONCAT44(in_stack_00000024,in_stack_00000020),in_stack_00000018,
                     in_stack_00000017,(ASN1_TLC *)CONCAT44(in_stack_0000000c,in_stack_00000008),
                     (int)ctx,(OSSL_LIB_CTX *)CONCAT17(opt,in_stack_00000068),(char *)tt);
  iVar4 = (int)((ulong)in_stack_00000018 >> 0x20);
  if (iVar1 == 0) {
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff74,iVar2),iVar4,pcVar3);
    ERR_set_error(0xd,0x8010a,(char *)0x0);
    return 0;
  }
  len_00 = (long)in_stack_ffffffffffffffa0 - ((long)puVar5 - (long)oclass);
  if (in_stack_ffffffffffffff8f == '\0') {
    if (len_00 == 0) goto LAB_0037d382;
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff74,iVar2),iVar4,pcVar3);
    ERR_set_error(0xd,0x77,(char *)0x0);
  }
  else {
    iVar1 = asn1_check_eoc((uchar **)&stack0xffffffffffffff98,len_00);
    if (iVar1 != 0) {
LAB_0037d382:
      *in_RSI = puVar5;
      return 1;
    }
    ERR_new();
    ERR_set_debug((char *)CONCAT44(in_stack_ffffffffffffff74,iVar2),iVar4,pcVar3);
    ERR_set_error(0xd,0x89,(char *)0x0);
  }
  return 0;
}

Assistant:

static int asn1_template_ex_d2i(ASN1_VALUE **val,
                                const unsigned char **in, long inlen,
                                const ASN1_TEMPLATE *tt, char opt,
                                ASN1_TLC *ctx, int depth,
                                OSSL_LIB_CTX *libctx, const char *propq)
{
    int flags, aclass;
    int ret;
    long len;
    const unsigned char *p, *q;
    char exp_eoc;
    if (!val)
        return 0;
    flags = tt->flags;
    aclass = flags & ASN1_TFLG_TAG_CLASS;

    p = *in;

    /* Check if EXPLICIT tag expected */
    if (flags & ASN1_TFLG_EXPTAG) {
        char cst;
        /*
         * Need to work out amount of data available to the inner content and
         * where it starts: so read in EXPLICIT header to get the info.
         */
        ret = asn1_check_tlen(&len, NULL, NULL, &exp_eoc, &cst,
                              &p, inlen, tt->tag, aclass, opt, ctx);
        q = p;
        if (!ret) {
            ERR_raise(ERR_LIB_ASN1, ERR_R_NESTED_ASN1_ERROR);
            return 0;
        } else if (ret == -1)
            return -1;
        if (!cst) {
            ERR_raise(ERR_LIB_ASN1, ASN1_R_EXPLICIT_TAG_NOT_CONSTRUCTED);
            return 0;
        }
        /* We've found the field so it can't be OPTIONAL now */
        ret = asn1_template_noexp_d2i(val, &p, len, tt, 0, ctx, depth, libctx,
                                      propq);
        if (!ret) {
            ERR_raise(ERR_LIB_ASN1, ERR_R_NESTED_ASN1_ERROR);
            return 0;
        }
        /* We read the field in OK so update length */
        len -= p - q;
        if (exp_eoc) {
            /* If NDEF we must have an EOC here */
            if (!asn1_check_eoc(&p, len)) {
                ERR_raise(ERR_LIB_ASN1, ASN1_R_MISSING_EOC);
                goto err;
            }
        } else {
            /*
             * Otherwise we must hit the EXPLICIT tag end or its an error
             */
            if (len) {
                ERR_raise(ERR_LIB_ASN1, ASN1_R_EXPLICIT_LENGTH_MISMATCH);
                goto err;
            }
        }
    } else
        return asn1_template_noexp_d2i(val, in, inlen, tt, opt, ctx, depth,
                                       libctx, propq);

    *in = p;
    return 1;

 err:
    return 0;
}